

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb.h
# Opt level: O3

FILE * stb_fopen(char *filename,char *mode)

{
  stb_ptrmap *a;
  int iVar1;
  int iVar2;
  char *pcVar3;
  size_t sVar4;
  FILE *pFVar5;
  undefined8 *v;
  ulong uVar6;
  uint uVar7;
  uint uVar8;
  int in_R9D;
  char name_full [4096];
  char temp_full [4108];
  byte local_2038 [4096];
  char local_1038 [7];
  undefined4 auStack_1031 [1028];
  
  if ((*mode != 'w') && (pcVar3 = strchr(mode,0x2b), pcVar3 == (char *)0x0)) {
    pFVar5 = fopen(filename,mode);
    return (FILE *)pFVar5;
  }
  local_2038[0] = 0;
  iVar1 = stb_fullpath((char *)local_2038,0x1000,filename);
  if (iVar1 != 0) {
    sVar4 = strlen((char *)local_2038);
    uVar6 = sVar4 & 0xffffffff;
    uVar7 = (int)sVar4 - 1;
    iVar1 = (int)sVar4 + 1;
    while (uVar6 = uVar6 - 1, iVar2 = ((int)uVar7 >> 0x1f & uVar7) + 1, 0 < iVar1 + -2) {
      iVar1 = iVar1 + -1;
      uVar8 = local_2038[(uint)uVar6 & 0x7fffffff] - 0x2f;
      iVar2 = iVar1;
      if (((uVar8 < 0x2e) && ((0x200000000801U >> ((ulong)uVar8 & 0x3f) & 1) != 0)) ||
         (local_2038[(uint)uVar6 & 0x7fffffff] == 0x7e)) break;
    }
    sVar4 = (size_t)iVar2;
    memcpy(local_1038,local_2038,sVar4);
    builtin_strncpy(local_1038 + sVar4,"stmpXXXX",8);
    *(undefined4 *)((long)auStack_1031 + sVar4) = 0x585858;
    iVar1 = mkstemp(local_1038);
    if (iVar1 != -1) {
      pFVar5 = fdopen(iVar1,mode);
      if (pFVar5 != (FILE *)0x0) {
        v = (undefined8 *)malloc(0x18);
        if (v != (undefined8 *)0x0) {
          if (stb__files == (stb_ptrmap *)0x0) {
            stb__files = stb_ptrmap_create();
          }
          a = stb__files;
          pcVar3 = strdup(local_1038);
          *v = pcVar3;
          pcVar3 = strdup((char *)local_2038);
          v[1] = pcVar3;
          *(undefined4 *)(v + 2) = 0;
          stb__stb_ptrmap_addset(a,pFVar5,v,1,0,in_R9D);
          return (FILE *)pFVar5;
        }
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/sienkiewiczkm[P]ltc_fitter/dependencies/stb/stb.h"
                      ,0x1579,"FILE *stb_fopen(char *, char *)");
      }
      unlink(local_1038);
      close(iVar1);
    }
  }
  return (FILE *)0x0;
}

Assistant:

FILE *  stb_fopen(char *filename, char *mode)
{
   FILE *f;
   char name_full[4096];
   char temp_full[sizeof(name_full) + 12];
   int p;
#ifdef _MSC_VER
   int j;
#endif
   if (mode[0] != 'w' && !strchr(mode, '+'))
      return stb__fopen(filename, mode);

   // save away the full path to the file so if the program
   // changes the cwd everything still works right! unix has
   // better ways to do this, but we have to work in windows
   name_full[0] = '\0'; // stb_fullpath reads name_full[0]
   if (stb_fullpath(name_full, sizeof(name_full), filename)==0)
      return 0;

   // try to generate a temporary file in the same directory
   p = strlen(name_full)-1;
   while (p > 0 && name_full[p] != '/' && name_full[p] != '\\'
                && name_full[p] != ':' && name_full[p] != '~')
      --p;
   ++p;

   memcpy(temp_full, name_full, p);

   #ifdef _MSC_VER
   // try multiple times to make a temp file... just in
   // case some other process makes the name first
   for (j=0; j < 32; ++j) {
      strcpy(temp_full+p, "stmpXXXXXX");
      if (stb_mktemp(temp_full) == NULL)
         return 0;

      f = fopen(temp_full, mode);
      if (f != NULL)
         break;
   }
   #else
   {
      strcpy(temp_full+p, "stmpXXXXXX");
      #ifdef __MINGW32__
         int fd = open(mktemp(temp_full), O_RDWR);
      #else
         int fd = mkstemp(temp_full);
      #endif
      if (fd == -1) return NULL;
      f = fdopen(fd, mode);
      if (f == NULL) {
         unlink(temp_full);
         close(fd);
         return NULL;
      }
   }
   #endif
   if (f != NULL) {
      stb__file_data *d = (stb__file_data *) malloc(sizeof(*d));
      if (!d) { assert(0);  /* NOTREACHED */fclose(f); return NULL; }
      if (stb__files == NULL) stb__files = stb_ptrmap_create();
      d->temp_name = strdup(temp_full);
      d->name      = strdup(name_full);
      d->errors    = 0;
      stb_ptrmap_add(stb__files, f, d);
      return f;
   }

   return NULL;
}